

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MANU.cpp
# Opt level: O2

int local_time(void)

{
  tm *ptVar1;
  time_t t;
  time_t local_10;
  
  time(&local_10);
  ptVar1 = localtime(&local_10);
  return ptVar1->tm_mday + ptVar1->tm_mon * 100 + ptVar1->tm_year * 10000 + 0x121eb24;
}

Assistant:

int local_time() {
    int tt;
    time_t t;
    struct tm *local;
    time(&t);
    local = localtime(&t);
    tt = (local->tm_year + 1900) * 10000 + (local->tm_mon + 1)
                                           * 100 + (local->tm_mday);
    return tt;
}